

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_bpf_reinit__internal(ma_bpf_config *pConfig,void *pHeap,ma_bpf *pBPF,ma_bool32 isNew)

{
  ma_format mVar1;
  ulong uVar2;
  ma_uint32 mVar3;
  uint uVar4;
  ma_result mVar5;
  ulong uVar6;
  ulong uVar7;
  ma_bpf_heap_layout heapLayout;
  ma_bpf_heap_layout local_78;
  ulong local_60;
  double local_58;
  ma_bpf2_config local_50;
  
  mVar5 = MA_INVALID_ARGS;
  if ((pConfig != (ma_bpf_config *)0x0 && pBPF != (ma_bpf *)0x0) &&
     ((mVar1 = pConfig->format, mVar1 == ma_format_f32 || (mVar1 == ma_format_s16)))) {
    if ((pBPF->format == ma_format_unknown || pBPF->format == mVar1) &&
       ((pBPF->channels == 0 || (pBPF->channels == pConfig->channels)))) {
      uVar4 = pConfig->order;
      uVar6 = (ulong)uVar4;
      if ((uVar4 & 1) == 0 && uVar6 < 9) {
        uVar4 = uVar4 >> 1;
        if (isNew == 0) {
          if (pBPF->bpf2Count != uVar4) {
            return MA_INVALID_OPERATION;
          }
          local_78.sizeInBytes = 0;
          local_78.bpf2Offset = 0;
        }
        else {
          mVar5 = ma_bpf_get_heap_layout(pConfig,&local_78);
          if (mVar5 != MA_SUCCESS) {
            return mVar5;
          }
          pBPF->_pHeap = pHeap;
          if (local_78.sizeInBytes != 0 && pHeap != (void *)0x0) {
            memset(pHeap,0,local_78.sizeInBytes);
          }
          pBPF->pBPF2 = (ma_bpf2 *)(local_78.bpf2Offset + (long)pHeap);
        }
        if (uVar6 != 0) {
          local_60 = (ulong)(uVar4 + (uVar4 == 0));
          uVar7 = 0;
          do {
            local_50.sampleRate = pConfig->sampleRate;
            local_50.cutoffFrequency = pConfig->cutoffFrequency;
            local_50.format = pConfig->format;
            local_50.channels = pConfig->channels;
            local_50._12_4_ = 0;
            local_50.q = 0.707107;
            if (isNew == 0) {
              mVar5 = ma_bpf2_reinit(&local_50,pBPF->pBPF2 + uVar7);
            }
            else {
              local_58 = (local_50.cutoffFrequency * 6.283185307179586) /
                         (double)local_50.sampleRate;
              sin(local_58);
              sin(1.5707963267948966 - local_58);
              uVar2 = (ulong)local_50._0_8_ >> 0x20;
              if (uVar2 == 0) {
                mVar5 = (uint)(uVar2 != 0) * 2 + MA_INVALID_ARGS;
              }
              else {
                mVar5 = ma_bpf2_init_preallocated
                                  (&local_50,
                                   (void *)((long)pHeap +
                                           uVar2 * uVar7 * 8 + local_78.bpf2Offset + uVar6 * 0x20),
                                   pBPF->pBPF2 + uVar7);
              }
            }
            if (mVar5 != MA_SUCCESS) {
              return mVar5;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != local_60);
        }
        pBPF->bpf2Count = uVar4;
        mVar3 = pConfig->channels;
        pBPF->format = pConfig->format;
        pBPF->channels = mVar3;
        mVar5 = MA_SUCCESS;
      }
    }
    else {
      mVar5 = MA_INVALID_OPERATION;
    }
  }
  return mVar5;
}

Assistant:

static ma_result ma_bpf_reinit__internal(const ma_bpf_config* pConfig, void* pHeap, ma_bpf* pBPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 bpf2Count;
    ma_uint32 ibpf2;
    ma_bpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pBPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pBPF->format != ma_format_unknown && pBPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pBPF->channels != 0 && pBPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    /* We must have an even number of order. */
    if ((pConfig->order & 0x1) != 0) {
        return MA_INVALID_ARGS;
    }

    bpf2Count = pConfig->order / 2;

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pBPF->bpf2Count != bpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_bpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pBPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pBPF->pBPF2 = (ma_bpf2*)ma_offset_ptr(pHeap, heapLayout.bpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);
    }

    for (ibpf2 = 0; ibpf2 < bpf2Count; ibpf2 += 1) {
        ma_bpf2_config bpf2Config;
        double q;

        /* TODO: Calculate Q to make this a proper Butterworth filter. */
        q = 0.707107;

        bpf2Config = ma_bpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t bpf2HeapSizeInBytes;

            result = ma_bpf2_get_heap_size(&bpf2Config, &bpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_bpf2_init_preallocated(&bpf2Config, ma_offset_ptr(pHeap, heapLayout.bpf2Offset + (sizeof(ma_bpf2) * bpf2Count) + (ibpf2 * bpf2HeapSizeInBytes)), &pBPF->pBPF2[ibpf2]);
            }
        } else {
            result = ma_bpf2_reinit(&bpf2Config, &pBPF->pBPF2[ibpf2]);
        }

        if (result != MA_SUCCESS) {
            return result;
        }
    }

    pBPF->bpf2Count = bpf2Count;
    pBPF->format    = pConfig->format;
    pBPF->channels  = pConfig->channels;

    return MA_SUCCESS;
}